

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined4 *puVar5;
  bool value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  puVar4 = &FLAGS_gtest_also_run_disabled_tests;
  local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_also_run_disabled_tests;
  bVar2 = ParseFlag(arg,"also_run_disabled_tests",(bool *)&local_40);
  if (!bVar2) {
    puVar4 = &FLAGS_gtest_break_on_failure;
    local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_break_on_failure;
    bVar2 = ParseFlag(arg,"break_on_failure",(bool *)&local_40);
    if (!bVar2) {
      puVar4 = &FLAGS_gtest_catch_exceptions;
      local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_catch_exceptions;
      bVar2 = ParseFlag(arg,"catch_exceptions",(bool *)&local_40);
      if (!bVar2) {
        paVar1 = &local_40.field_2;
        local_40._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_40,FLAGS_gtest_color_abi_cxx11_,
                   DAT_0016b290 + FLAGS_gtest_color_abi_cxx11_);
        bVar2 = ParseFlag<std::__cxx11::string>(arg,"color",&local_40);
        if (bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &FLAGS_gtest_color_abi_cxx11_,&local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
        if (bVar2) {
          return true;
        }
        local_40._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_40,FLAGS_gtest_death_test_style_abi_cxx11_,
                   DAT_0016b3e8 + FLAGS_gtest_death_test_style_abi_cxx11_);
        bVar2 = ParseFlag<std::__cxx11::string>(arg,"death_test_style",&local_40);
        if (bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &FLAGS_gtest_death_test_style_abi_cxx11_,&local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          return true;
        }
        puVar4 = &FLAGS_gtest_death_test_use_fork;
        local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_death_test_use_fork;
        bVar2 = ParseFlag(arg,"death_test_use_fork",(bool *)&local_40);
        if (!bVar2) {
          puVar4 = &FLAGS_gtest_fail_fast;
          local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_fail_fast;
          bVar2 = ParseFlag(arg,"fail_fast",(bool *)&local_40);
          if (!bVar2) {
            local_40._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_40,FLAGS_gtest_filter_abi_cxx11_,
                       DAT_0016b2b0 + FLAGS_gtest_filter_abi_cxx11_);
            bVar2 = ParseFlag<std::__cxx11::string>(arg,"filter",&local_40);
            if (bVar2) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &FLAGS_gtest_filter_abi_cxx11_,&local_40);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != paVar1) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              return true;
            }
            local_40._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_40,FLAGS_gtest_internal_run_death_test_abi_cxx11_,
                       DAT_0016b3c8 + FLAGS_gtest_internal_run_death_test_abi_cxx11_);
            bVar2 = ParseFlag<std::__cxx11::string>(arg,"internal_run_death_test",&local_40);
            if (bVar2) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &FLAGS_gtest_internal_run_death_test_abi_cxx11_,&local_40);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != paVar1) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              return true;
            }
            puVar4 = &FLAGS_gtest_list_tests;
            local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_list_tests;
            bVar2 = ParseFlag(arg,"list_tests",(bool *)&local_40);
            if (!bVar2) {
              local_40._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_40,FLAGS_gtest_output_abi_cxx11_,
                         DAT_0016b2d8 + FLAGS_gtest_output_abi_cxx11_);
              bVar2 = ParseFlag<std::__cxx11::string>(arg,"output",&local_40);
              if (bVar2) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &FLAGS_gtest_output_abi_cxx11_,&local_40);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_40._M_dataplus._M_p != paVar1) {
                operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar2) {
                return true;
              }
              puVar4 = &FLAGS_gtest_brief;
              local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_brief;
              bVar2 = ParseFlag(arg,"brief",(bool *)&local_40);
              if (!bVar2) {
                puVar4 = &FLAGS_gtest_print_time;
                local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_print_time;
                bVar2 = ParseFlag(arg,"print_time",(bool *)&local_40);
                if (!bVar2) {
                  puVar4 = &FLAGS_gtest_print_utf8;
                  local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_print_utf8;
                  bVar2 = ParseFlag(arg,"print_utf8",(bool *)&local_40);
                  if (!bVar2) {
                    puVar5 = &FLAGS_gtest_random_seed;
                    local_40._M_dataplus._M_p._0_4_ = FLAGS_gtest_random_seed;
                    bVar2 = ParseFlag(arg,"random_seed",(int32_t *)&local_40);
                    if (!bVar2) {
                      puVar5 = &FLAGS_gtest_repeat;
                      local_40._M_dataplus._M_p._0_4_ = FLAGS_gtest_repeat;
                      bVar2 = ParseFlag(arg,"repeat",(int32_t *)&local_40);
                      if (!bVar2) {
                        puVar4 = &FLAGS_gtest_recreate_environments_when_repeating;
                        local_40._M_dataplus._M_p._0_1_ =
                             FLAGS_gtest_recreate_environments_when_repeating;
                        bVar2 = ParseFlag(arg,"recreate_environments_when_repeating",
                                          (bool *)&local_40);
                        if (!bVar2) {
                          puVar4 = &FLAGS_gtest_shuffle;
                          local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_shuffle;
                          bVar2 = ParseFlag(arg,"shuffle",(bool *)&local_40);
                          if (!bVar2) {
                            puVar5 = &FLAGS_gtest_stack_trace_depth;
                            local_40._M_dataplus._M_p._0_4_ = FLAGS_gtest_stack_trace_depth;
                            bVar2 = ParseFlag(arg,"stack_trace_depth",(int32_t *)&local_40);
                            if (bVar2) goto LAB_00148151;
                            local_40._M_dataplus._M_p = (pointer)paVar1;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_40,FLAGS_gtest_stream_result_to_abi_cxx11_,
                                       DAT_0016b310 + FLAGS_gtest_stream_result_to_abi_cxx11_);
                            bVar2 = ParseFlag<std::__cxx11::string>
                                              (arg,"stream_result_to",&local_40);
                            if (bVar2) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&FLAGS_gtest_stream_result_to_abi_cxx11_,&local_40);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_40._M_dataplus._M_p != paVar1) {
                              operator_delete(local_40._M_dataplus._M_p,
                                              local_40.field_2._M_allocated_capacity + 1);
                            }
                            if (bVar2) {
                              return true;
                            }
                            puVar4 = &FLAGS_gtest_throw_on_failure;
                            local_40._M_dataplus._M_p._0_1_ = FLAGS_gtest_throw_on_failure;
                            bVar3 = ParseFlag(arg,"throw_on_failure",(bool *)&local_40);
                            if (!bVar3) {
                              return bVar3;
                            }
                          }
                        }
                        goto LAB_00147f1c;
                      }
                    }
LAB_00148151:
                    *puVar5 = local_40._M_dataplus._M_p._0_4_;
                    return true;
                  }
                }
              }
            }
          }
        }
LAB_00147f1c:
        *puVar4 = local_40._M_dataplus._M_p._0_1_;
        return bVar3;
      }
    }
  }
  *puVar4 = local_40._M_dataplus._M_p._0_1_;
  return true;
}

Assistant:

static bool ParseGoogleTestFlag(const char* const arg) {
#define GTEST_INTERNAL_PARSE_FLAG(flag_name)  \
  do {                                        \
    auto value = GTEST_FLAG_GET(flag_name);   \
    if (ParseFlag(arg, #flag_name, &value)) { \
      GTEST_FLAG_SET(flag_name, value);       \
      return true;                            \
    }                                         \
  } while (false)

  GTEST_INTERNAL_PARSE_FLAG(also_run_disabled_tests);
  GTEST_INTERNAL_PARSE_FLAG(break_on_failure);
  GTEST_INTERNAL_PARSE_FLAG(catch_exceptions);
  GTEST_INTERNAL_PARSE_FLAG(color);
  GTEST_INTERNAL_PARSE_FLAG(death_test_style);
  GTEST_INTERNAL_PARSE_FLAG(death_test_use_fork);
  GTEST_INTERNAL_PARSE_FLAG(fail_fast);
  GTEST_INTERNAL_PARSE_FLAG(filter);
  GTEST_INTERNAL_PARSE_FLAG(internal_run_death_test);
  GTEST_INTERNAL_PARSE_FLAG(list_tests);
  GTEST_INTERNAL_PARSE_FLAG(output);
  GTEST_INTERNAL_PARSE_FLAG(brief);
  GTEST_INTERNAL_PARSE_FLAG(print_time);
  GTEST_INTERNAL_PARSE_FLAG(print_utf8);
  GTEST_INTERNAL_PARSE_FLAG(random_seed);
  GTEST_INTERNAL_PARSE_FLAG(repeat);
  GTEST_INTERNAL_PARSE_FLAG(recreate_environments_when_repeating);
  GTEST_INTERNAL_PARSE_FLAG(shuffle);
  GTEST_INTERNAL_PARSE_FLAG(stack_trace_depth);
  GTEST_INTERNAL_PARSE_FLAG(stream_result_to);
  GTEST_INTERNAL_PARSE_FLAG(throw_on_failure);
  return false;
}